

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

int __thiscall String::compareIgnoreCase(String *this,String *other)

{
  byte bVar1;
  byte bVar2;
  char c2;
  char *pcStack_30;
  char c1;
  char *s2;
  char *s1;
  String *other_local;
  String *this_local;
  
  s2 = operator_cast_to_char_(this);
  pcStack_30 = operator_cast_to_char_(other);
  while( true ) {
    bVar1 = toLowerCase(*s2);
    bVar2 = toLowerCase(*pcStack_30);
    if (bVar1 != bVar2) {
      return (uint)bVar1 - (uint)bVar2;
    }
    if (*s2 == '\0') break;
    s2 = s2 + 1;
    pcStack_30 = pcStack_30 + 1;
  }
  return 0;
}

Assistant:

int compareIgnoreCase(const String& other) const
  {
    const char* s1 = *this, * s2 = other;
    char c1, c2;
    for(; (c1 = toLowerCase(*s1)) == (c2 = toLowerCase(*s2)); ++s1, ++s2)
      if(!*s1)
        return 0;
    return (int)(const uchar&)c1 - (const uchar&)c2;
  }